

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImU32 IVar3;
  uint uVar4;
  GetterXsYs<unsigned_int> *pGVar5;
  ImDrawVert *pIVar6;
  ImDrawVert *pIVar7;
  uint *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  int iVar11;
  long lVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pGVar5 = this->Getter;
  iVar11 = pGVar5->Count;
  lVar12 = (long)(((pGVar5->Offset + prim + 1) % iVar11 + iVar11) % iVar11) * (long)pGVar5->Stride;
  iVar11 = this->Transformer->YAxis;
  auVar16._4_4_ = 0;
  auVar16._0_4_ = *(uint *)((long)pGVar5->Xs + lVar12);
  auVar16._8_4_ = *(uint *)((long)pGVar5->Ys + lVar12);
  auVar16._12_4_ = 0;
  IVar1 = GImPlot->PixelRange[iVar11].Min;
  IVar13.x = (float)(GImPlot->Mx *
                     ((SUB168(auVar16 | _DAT_004a9740,0) - (double)DAT_004a9740) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  IVar13.y = (float)(GImPlot->My[iVar11] *
                     ((SUB168(auVar16 | _DAT_004a9740,8) - DAT_004a9740._8_8_) -
                     GImPlot->CurrentPlot->YAxis[iVar11].Range.Min) + (double)IVar1.y);
  fVar14 = (this->P1).x;
  fVar15 = (this->P1).y;
  auVar20._0_4_ = ~-(uint)(IVar13.x <= fVar14) & (uint)IVar13.x;
  auVar20._4_4_ = ~-(uint)(IVar13.y <= fVar15) & (uint)IVar13.y;
  auVar20._8_4_ = ~-(uint)(fVar14 < IVar13.x) & (uint)IVar13.x;
  auVar20._12_4_ = ~-(uint)(fVar15 < IVar13.y) & (uint)IVar13.y;
  auVar9._4_4_ = (uint)fVar15 & -(uint)(IVar13.y <= fVar15);
  auVar9._0_4_ = (uint)fVar14 & -(uint)(IVar13.x <= fVar14);
  auVar9._8_4_ = (uint)fVar14 & -(uint)(fVar14 < IVar13.x);
  auVar9._12_4_ = (uint)fVar15 & -(uint)(fVar15 < IVar13.y);
  auVar20 = auVar20 | auVar9;
  fVar17 = (cull_rect->Min).y;
  auVar10._4_8_ = auVar20._8_8_;
  auVar10._0_4_ = -(uint)(auVar20._4_4_ < fVar17);
  auVar21._0_8_ = auVar10._0_8_ << 0x20;
  auVar21._8_4_ = -(uint)(auVar20._8_4_ < (cull_rect->Max).x);
  auVar21._12_4_ = -(uint)(auVar20._12_4_ < (cull_rect->Max).y);
  auVar22._4_4_ = -(uint)(fVar17 < auVar20._4_4_);
  auVar22._0_4_ = -(uint)((cull_rect->Min).x < auVar20._0_4_);
  auVar22._8_8_ = auVar21._8_8_;
  iVar11 = movmskps((int)lVar12,auVar22);
  if (iVar11 == 0xf) {
    IVar3 = this->Col;
    IVar1 = *uv;
    fVar17 = IVar13.x - fVar14;
    fVar18 = IVar13.y - fVar15;
    fVar19 = fVar17 * fVar17 + fVar18 * fVar18;
    if (0.0 < fVar19) {
      fVar19 = 1.0 / SQRT(fVar19);
      fVar17 = fVar17 * fVar19;
      fVar18 = fVar18 * fVar19;
    }
    fVar19 = this->Weight * 0.5;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = IVar3;
    fVar17 = fVar19 * fVar17;
    fVar19 = fVar19 * fVar18;
    (pIVar6->pos).x = fVar14 + fVar19;
    (pIVar6->pos).y = fVar15 - fVar17;
    pIVar7[1].pos.x = fVar19 + IVar13.x;
    pIVar7[1].pos.y = IVar13.y - fVar17;
    pIVar7[1].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = IVar3;
    pIVar6[2].pos.x = IVar13.x - fVar19;
    pIVar6[2].pos.y = fVar17 + IVar13.y;
    pIVar6[2].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = IVar3;
    IVar2 = this->P1;
    pIVar6[3].pos.x = IVar2.x - fVar19;
    pIVar6[3].pos.y = IVar2.y + fVar17;
    pIVar6[3].uv.x = IVar1.x;
    pIVar6[3].uv.y = IVar1.y;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar6 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar8 = DrawList->_IdxWritePtr;
    *puVar8 = uVar4;
    puVar8[1] = uVar4 + 1;
    puVar8[2] = DrawList->_VtxCurrentIdx + 2;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar8[3] = uVar4;
    puVar8[4] = uVar4 + 2;
    puVar8[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar8 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar13;
  return (char)iVar11 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }